

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O3

void __thiscall nonius::standard_reporter::do_estimate_clock_cost_start(standard_reporter *this)

{
  basic_ostream<char,_std::char_traits<char>_> *pbVar1;
  
  if (this->verbose != true) {
    return;
  }
  if ((this->super_reporter).os.super__Function_base._M_manager != (_Manager_type)0x0) {
    pbVar1 = (*(this->super_reporter).os._M_invoker)((_Any_data *)&(this->super_reporter).os);
    std::__ostream_insert<char,std::char_traits<char>>
              (pbVar1,"estimating cost of a clock call\n",0x20);
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void do_estimate_clock_cost_start() override {
            if(verbose) report_stream() << "estimating cost of a clock call\n";
        }